

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_intrapred_sse2.c
# Opt level: O3

void aom_highbd_h_predictor_32x16_sse2
               (uint16_t *dst,ptrdiff_t stride,uint16_t *above,uint16_t *left,int bd)

{
  uint16_t *puVar1;
  bool bVar2;
  bool bVar3;
  undefined4 uVar5;
  undefined1 auVar4 [16];
  undefined1 in_XMM1 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  
  bVar2 = true;
  do {
    bVar3 = bVar2;
    auVar4 = *(undefined1 (*) [16])left;
    auVar6 = pshuflw(in_XMM1,auVar4,0);
    auVar6._4_4_ = auVar6._0_4_;
    auVar6._8_4_ = auVar6._0_4_;
    auVar6._12_4_ = auVar6._0_4_;
    *(undefined1 (*) [16])dst = auVar6;
    *(undefined1 (*) [16])((long)dst + 0x10) = auVar6;
    *(undefined1 (*) [16])((long)dst + 0x20) = auVar6;
    *(undefined1 (*) [16])((long)dst + 0x30) = auVar6;
    auVar6 = pshuflw(auVar6,auVar4,0x55);
    auVar7._0_4_ = auVar6._0_4_;
    auVar7._4_4_ = auVar7._0_4_;
    auVar7._8_4_ = auVar7._0_4_;
    auVar7._12_4_ = auVar7._0_4_;
    *(undefined1 (*) [16])((long)*(undefined1 (*) [16])dst + stride * 2) = auVar7;
    *(undefined1 (*) [16])((long)*(undefined1 (*) [16])((long)dst + 0x10) + stride * 2) = auVar7;
    *(undefined1 (*) [16])((long)*(undefined1 (*) [16])((long)dst + 0x20) + stride * 2) = auVar7;
    *(undefined1 (*) [16])((long)*(undefined1 (*) [16])((long)dst + 0x30) + stride * 2) = auVar7;
    auVar6 = pshuflw(auVar7,auVar4,0xaa);
    auVar8._0_4_ = auVar6._0_4_;
    auVar8._4_4_ = auVar8._0_4_;
    auVar8._8_4_ = auVar8._0_4_;
    auVar8._12_4_ = auVar8._0_4_;
    *(undefined1 (*) [16])((long)*(undefined1 (*) [16])dst + stride * 2 * 2) = auVar8;
    *(undefined1 (*) [16])((long)*(undefined1 (*) [16])((long)dst + 0x10) + stride * 2 * 2) = auVar8
    ;
    *(undefined1 (*) [16])((long)*(undefined1 (*) [16])((long)dst + 0x20) + stride * 2 * 2) = auVar8
    ;
    *(undefined1 (*) [16])((long)*(undefined1 (*) [16])((long)dst + 0x30) + stride * 2 * 2) = auVar8
    ;
    auVar6 = pshuflw(auVar8,auVar4,0xff);
    auVar9._0_4_ = auVar6._0_4_;
    auVar9._4_4_ = auVar9._0_4_;
    auVar9._8_4_ = auVar9._0_4_;
    auVar9._12_4_ = auVar9._0_4_;
    *(undefined1 (*) [16])((long)*(undefined1 (*) [16])dst + stride * 3 * 2) = auVar9;
    *(undefined1 (*) [16])((long)*(undefined1 (*) [16])((long)dst + 0x10) + stride * 3 * 2) = auVar9
    ;
    *(undefined1 (*) [16])((long)*(undefined1 (*) [16])((long)dst + 0x20) + stride * 3 * 2) = auVar9
    ;
    *(undefined1 (*) [16])((long)*(undefined1 (*) [16])((long)dst + 0x30) + stride * 3 * 2) = auVar9
    ;
    auVar6 = pshufhw(auVar9,auVar4,0);
    auVar10._8_4_ = auVar6._8_4_;
    auVar10._4_4_ = auVar10._8_4_;
    auVar10._0_4_ = auVar10._8_4_;
    auVar10._12_4_ = auVar10._8_4_;
    *(undefined1 (*) [16])((long)*(undefined1 (*) [16])dst + stride * 4 * 2) = auVar10;
    *(undefined1 (*) [16])((long)*(undefined1 (*) [16])((long)dst + 0x10) + stride * 4 * 2) =
         auVar10;
    *(undefined1 (*) [16])((long)*(undefined1 (*) [16])((long)dst + 0x20) + stride * 4 * 2) =
         auVar10;
    *(undefined1 (*) [16])((long)*(undefined1 (*) [16])((long)dst + 0x30) + stride * 4 * 2) =
         auVar10;
    auVar6 = pshufhw(auVar10,auVar4,0x55);
    auVar11._8_4_ = auVar6._8_4_;
    auVar11._4_4_ = auVar11._8_4_;
    auVar11._0_4_ = auVar11._8_4_;
    auVar11._12_4_ = auVar11._8_4_;
    *(undefined1 (*) [16])((long)*(undefined1 (*) [16])dst + stride * 5 * 2) = auVar11;
    *(undefined1 (*) [16])((long)*(undefined1 (*) [16])((long)dst + 0x10) + stride * 5 * 2) =
         auVar11;
    *(undefined1 (*) [16])((long)*(undefined1 (*) [16])((long)dst + 0x20) + stride * 5 * 2) =
         auVar11;
    *(undefined1 (*) [16])((long)*(undefined1 (*) [16])((long)dst + 0x30) + stride * 5 * 2) =
         auVar11;
    auVar6 = pshufhw(auVar11,auVar4,0xaa);
    in_XMM1._8_4_ = auVar6._8_4_;
    in_XMM1._4_4_ = in_XMM1._8_4_;
    in_XMM1._0_4_ = in_XMM1._8_4_;
    in_XMM1._12_4_ = in_XMM1._8_4_;
    *(undefined1 (*) [16])((long)*(undefined1 (*) [16])dst + stride * 6 * 2) = in_XMM1;
    *(undefined1 (*) [16])((long)*(undefined1 (*) [16])((long)dst + 0x10) + stride * 6 * 2) =
         in_XMM1;
    *(undefined1 (*) [16])((long)*(undefined1 (*) [16])((long)dst + 0x20) + stride * 6 * 2) =
         in_XMM1;
    *(undefined1 (*) [16])((long)*(undefined1 (*) [16])((long)dst + 0x30) + stride * 6 * 2) =
         in_XMM1;
    auVar4 = pshufhw(auVar4,auVar4,0xff);
    uVar5 = auVar4._8_4_;
    puVar1 = (uint16_t *)((long)*(undefined1 (*) [16])dst + stride * 7 * 2);
    *(undefined4 *)puVar1 = uVar5;
    *(undefined4 *)(puVar1 + 2) = uVar5;
    *(undefined4 *)(puVar1 + 4) = uVar5;
    *(undefined4 *)(puVar1 + 6) = uVar5;
    puVar1 = (uint16_t *)((long)*(undefined1 (*) [16])((long)dst + 0x10) + stride * 7 * 2);
    *(undefined4 *)puVar1 = uVar5;
    *(undefined4 *)(puVar1 + 2) = uVar5;
    *(undefined4 *)(puVar1 + 4) = uVar5;
    *(undefined4 *)(puVar1 + 6) = uVar5;
    puVar1 = (uint16_t *)((long)*(undefined1 (*) [16])((long)dst + 0x20) + stride * 7 * 2);
    *(undefined4 *)puVar1 = uVar5;
    *(undefined4 *)(puVar1 + 2) = uVar5;
    *(undefined4 *)(puVar1 + 4) = uVar5;
    *(undefined4 *)(puVar1 + 6) = uVar5;
    puVar1 = (uint16_t *)((long)*(undefined1 (*) [16])((long)dst + 0x30) + stride * 7 * 2);
    *(undefined4 *)puVar1 = uVar5;
    *(undefined4 *)(puVar1 + 2) = uVar5;
    *(undefined4 *)(puVar1 + 4) = uVar5;
    *(undefined4 *)(puVar1 + 6) = uVar5;
    left = (uint16_t *)((long)left + 0x10);
    dst = (uint16_t *)((long)dst + stride * 0x10);
    bVar2 = false;
  } while (bVar3);
  return;
}

Assistant:

void aom_highbd_h_predictor_32x16_sse2(uint16_t *dst, ptrdiff_t stride,
                                       const uint16_t *above,
                                       const uint16_t *left, int bd) {
  int i;
  (void)above;
  (void)bd;

  for (i = 0; i < 2; i++, left += 8) {
    h_predictor_32x8(dst, stride, left);
    dst += stride << 3;
  }
}